

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

vec3 closest_point_point_obb(vec3 p,vec3 bc,vec3 bx,vec3 by,vec3 bz,float bex,float bey,float bez)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec3 v1;
  vec3 v;
  vec3 vVar5;
  vec3 vVar6;
  float local_190;
  float fStack_18c;
  float local_188;
  float local_108;
  int local_104;
  float dist;
  int i;
  vec3 d;
  float be [3];
  vec3 bu [3];
  vec3 by_local;
  vec3 bx_local;
  vec3 bc_local;
  vec3 p_local;
  vec3 q;
  
  bu[1].x = by.z;
  bu[0]._4_8_ = by._0_8_;
  bu[0].x = bx.z;
  be._4_8_ = bx._0_8_;
  q.x = bc.z;
  p_local._4_8_ = bc._0_8_;
  bu[2].x = bz.z;
  bu[1].y = bz.x;
  bu[1].z = bz.y;
  be[0] = bez;
  unique0x10000377 = bu[0]._4_8_;
  vVar5 = vec3_sub(p,bc);
  for (local_104 = 0; local_104 < 3; local_104 = local_104 + 1) {
    uVar1 = bu[(long)local_104 + -1].y;
    uVar3 = bu[(long)local_104 + -1].z;
    vVar6.y = (float)uVar3;
    vVar6.x = (float)uVar1;
    vVar6.z = bu[local_104].x;
    local_108 = vec3_dot(vVar5,vVar6);
    if (be[(long)local_104 + -2] <= local_108 && local_108 != be[(long)local_104 + -2]) {
      local_108 = be[(long)local_104 + -2];
    }
    if (local_108 < -be[(long)local_104 + -2]) {
      local_108 = -be[(long)local_104 + -2];
    }
    uVar2 = bu[(long)local_104 + -1].y;
    uVar4 = bu[(long)local_104 + -1].z;
    v.y = (float)uVar4;
    v.x = (float)uVar2;
    v.z = bu[local_104].x;
    vVar6 = vec3_scale(v,local_108);
    v1.z = q.x;
    v1.x = p_local.y;
    v1.y = p_local.z;
    vVar6 = vec3_add(v1,vVar6);
    _local_190 = vVar6._0_8_;
    local_188 = vVar6.z;
    p_local.y = local_190;
    p_local.z = fStack_18c;
    q.x = local_188;
  }
  vVar5.z = q.x;
  vVar5.x = p_local.y;
  vVar5.y = p_local.z;
  return vVar5;
}

Assistant:

vec3 closest_point_point_obb(vec3 p, vec3 bc, vec3 bx, vec3 by, vec3 bz, float bex, float bey, float bez) {
    vec3 bu[3] = {bx, by, bz};
    float be[3] = {bex, bey, bez};
    vec3 d = vec3_sub(p, bc);    
    vec3 q = bc;
    for (int i = 0; i < 3; i++) {
        float dist = vec3_dot(d, bu[i]);
        if (dist > be[i]) dist = be[i];
        if (dist < -be[i]) dist = -be[i];
        q = vec3_add(q, vec3_scale(bu[i], dist));
    }
    return q;
}